

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

string * __thiscall
pbrt::SimpleVolPathIntegrator::ToString_abi_cxx11_(SimpleVolPathIntegrator *this)

{
  string *in_RDI;
  int *in_stack_00000010;
  char *in_stack_00000018;
  
  StringPrintf<int_const&>(in_stack_00000018,in_stack_00000010);
  return in_RDI;
}

Assistant:

std::string SimpleVolPathIntegrator::ToString() const {
    return StringPrintf("[ SimpleVolPathIntegrator maxDepth: %d ] ", maxDepth);
}